

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

void __thiscall snestistics::LargeBitfield::set_bit(LargeBitfield *this,uint32_t p,bool newStat)

{
  bool bVar1;
  uint uVar2;
  uint local_24;
  uint32_t current;
  uint32_t mask;
  uint32_t bucket;
  bool newStat_local;
  uint32_t p_local;
  LargeBitfield *this_local;
  
  uVar2 = 1 << ((byte)p & 0x1f);
  local_24 = this->_state[p >> 5] & (uVar2 ^ 0xffffffff);
  if (newStat) {
    local_24 = uVar2 | local_24;
  }
  this->_state[p >> 5] = local_24;
  bVar1 = operator[](this,p);
  if (bVar1 == newStat) {
    return;
  }
  __assert_fail("this->operator[](p) == newStat",
                "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/source/utils.h"
                ,0x44,"void snestistics::LargeBitfield::set_bit(const uint32_t, const bool)");
}

Assistant:

void set_bit(const uint32_t p, const bool newStat = true) {
		uint32_t bucket = p / 32;
		uint32_t mask = 1 << (p & 31);
		uint32_t current = _state[bucket] & ~mask;
		if (newStat)
			current |= mask;
		_state[bucket] = current;
		assert(this->operator[](p) == newStat);
	}